

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

Var Js::JavascriptPromise::CreateThenPromise
              (JavascriptPromise *sourcePromise,RecyclableObject *fulfillmentHandler,
              RecyclableObject *rejectionHandler,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  JavascriptLibrary *this;
  JavascriptFunction *defaultConstructor_00;
  JavascriptFunction *threadContext;
  undefined4 *puVar3;
  ThreadContext *pTVar4;
  JavascriptPromiseCapability *capability;
  Var pvVar5;
  ScriptContext *in_R9;
  anon_class_16_2_93ddcb53_for_newObjectCreationFunction newObjectCreationFunction;
  JavascriptPromiseCapability *promiseCapability;
  bool isDefaultConstructor;
  RecyclableObject *constructor;
  JavascriptFunction *defaultConstructor;
  ScriptContext *scriptContext_local;
  RecyclableObject *rejectionHandler_local;
  RecyclableObject *fulfillmentHandler_local;
  JavascriptPromise *sourcePromise_local;
  
  this = ScriptContext::GetLibrary(scriptContext);
  defaultConstructor_00 =
       JavascriptLibraryBase::GetPromiseConstructor(&this->super_JavascriptLibraryBase);
  threadContext =
       (JavascriptFunction *)
       Js::JavascriptOperators::SpeciesConstructor
                 ((RecyclableObject *)sourcePromise,defaultConstructor_00,scriptContext);
  bVar2 = Js::JavascriptOperators::IsConstructor((RecyclableObject *)threadContext);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x5a4,"(JavascriptOperators::IsConstructor(constructor))",
                                "JavascriptOperators::IsConstructor(constructor)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pTVar4 = ScriptContext::GetThreadContext(scriptContext);
  newObjectCreationFunction.scriptContext = in_R9;
  newObjectCreationFunction.constructor = (RecyclableObject *)scriptContext;
  capability = (JavascriptPromiseCapability *)
               Js::JavascriptOperators::
               NewObjectCreationHelper_ReentrancySafe<Js::JavascriptPromise::CreateThenPromise(Js::JavascriptPromise*,Js::RecyclableObject*,Js::RecyclableObject*,Js::ScriptContext*)::__0>
                         ((JavascriptOperators *)threadContext,
                          (RecyclableObject *)(ulong)(threadContext == defaultConstructor_00),
                          SUB81(pTVar4,0),(ThreadContext *)threadContext,newObjectCreationFunction);
  PerformPromiseThen(sourcePromise,capability,fulfillmentHandler,rejectionHandler,scriptContext);
  pvVar5 = JavascriptPromiseCapability::GetPromise(capability);
  return pvVar5;
}

Assistant:

Var JavascriptPromise::CreateThenPromise(JavascriptPromise* sourcePromise, RecyclableObject* fulfillmentHandler, RecyclableObject* rejectionHandler, ScriptContext* scriptContext)
    {
        JavascriptFunction* defaultConstructor = scriptContext->GetLibrary()->GetPromiseConstructor();
        RecyclableObject* constructor = JavascriptOperators::SpeciesConstructor(sourcePromise, defaultConstructor, scriptContext);
        AssertOrFailFast(JavascriptOperators::IsConstructor(constructor));

        bool isDefaultConstructor = constructor == defaultConstructor;
        JavascriptPromiseCapability* promiseCapability = (JavascriptPromiseCapability*)JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isDefaultConstructor, scriptContext->GetThreadContext(), [=]()->JavascriptPromiseCapability*
        {
            return NewPromiseCapability(constructor, scriptContext);
        });

        PerformPromiseThen(sourcePromise, promiseCapability, fulfillmentHandler, rejectionHandler, scriptContext);

        return promiseCapability->GetPromise();
    }